

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

int __thiscall
gl3cts::TransformFeedbackOverflowQueryTests::init
          (TransformFeedbackOverflowQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TransformFeedbackOverflowQueryStateUpdate *this_00;
  TransformFeedbackOverflowQueryErrorInvalidIndex *this_01;
  TransformFeedbackOverflowQueryErrorAlreadyActive *this_02;
  TransformFeedbackOverflowQueryErrorIncompatibleTarget *this_03;
  TransformFeedbackOverflowQueryErrorNoActiveQuery *this_04;
  
  pTVar1 = (TestNode *)operator_new(0x80);
  TransformFeedbackOverflowQueryImplDepState::TransformFeedbackOverflowQueryImplDepState
            ((TransformFeedbackOverflowQueryImplDepState *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,"implementation-dependent-state");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  TransformFeedbackOverflowQueryDefaultState::TransformFeedbackOverflowQueryDefaultState
            ((TransformFeedbackOverflowQueryDefaultState *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,"default-context-state");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (TransformFeedbackOverflowQueryStateUpdate *)operator_new(0x88);
  TransformFeedbackOverflowQueryStateUpdate::TransformFeedbackOverflowQueryStateUpdate
            (this_00,(this->super_TestCaseGroup).m_context,this->m_api,"context-state-update");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TransformFeedbackOverflowQueryErrorInvalidIndex *)operator_new(0x90);
  TransformFeedbackOverflowQueryErrorInvalidIndex::TransformFeedbackOverflowQueryErrorInvalidIndex
            (this_01,(this->super_TestCaseGroup).m_context,this->m_api,"error-invalid-index");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TransformFeedbackOverflowQueryErrorAlreadyActive *)operator_new(0x98);
  TransformFeedbackOverflowQueryErrorAlreadyActive::TransformFeedbackOverflowQueryErrorAlreadyActive
            (this_02,(this->super_TestCaseGroup).m_context,this->m_api,"error-already-active");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TransformFeedbackOverflowQueryErrorIncompatibleTarget *)operator_new(0x98);
  TransformFeedbackOverflowQueryErrorIncompatibleTarget::
  TransformFeedbackOverflowQueryErrorIncompatibleTarget
            (this_03,(this->super_TestCaseGroup).m_context,this->m_api,"error-incompatible-target");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TransformFeedbackOverflowQueryErrorNoActiveQuery *)operator_new(0x90);
  TransformFeedbackOverflowQueryErrorNoActiveQuery::TransformFeedbackOverflowQueryErrorNoActiveQuery
            (this_04,(this->super_TestCaseGroup).m_context,this->m_api,"error-no-active-query");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs::
  TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs
            ((TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "basic-single-stream-interleaved-attribs");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs::
  TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs
            ((TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "basic-single-stream-separate-attribs");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs::
  TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs
            ((TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "advanced-single-stream-interleaved-attribs");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryAdvancedSingleStreamSeparateAttribs::
  TransformFeedbackOverflowQueryAdvancedSingleStreamSeparateAttribs
            ((TransformFeedbackOverflowQueryAdvancedSingleStreamSeparateAttribs *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "advanced-single-stream-separate-attribs");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream::
  TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream
            ((TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "multiple-streams-one-buffer-per-stream");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream::
  TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream
            ((TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream *)pTVar1,
             (this->super_TestCaseGroup).m_context,this->m_api,
             "multiple-streams-multiple-buffers-per-stream");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TransformFeedbackOverflowQueryTests::init(void)
{
	addChild(new TransformFeedbackOverflowQueryImplDepState(m_context, m_api, "implementation-dependent-state"));
	addChild(new TransformFeedbackOverflowQueryDefaultState(m_context, m_api, "default-context-state"));
	addChild(new TransformFeedbackOverflowQueryStateUpdate(m_context, m_api, "context-state-update"));
	addChild(new TransformFeedbackOverflowQueryErrorInvalidIndex(m_context, m_api, "error-invalid-index"));
	addChild(new TransformFeedbackOverflowQueryErrorAlreadyActive(m_context, m_api, "error-already-active"));
	addChild(new TransformFeedbackOverflowQueryErrorIncompatibleTarget(m_context, m_api, "error-incompatible-target"));
	addChild(new TransformFeedbackOverflowQueryErrorNoActiveQuery(m_context, m_api, "error-no-active-query"));
	addChild(new TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs(
		m_context, m_api, "basic-single-stream-interleaved-attribs"));
	addChild(new TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs(
		m_context, m_api, "basic-single-stream-separate-attribs"));
	addChild(new TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs(
		m_context, m_api, "advanced-single-stream-interleaved-attribs"));
	addChild(new TransformFeedbackOverflowQueryAdvancedSingleStreamSeparateAttribs(
		m_context, m_api, "advanced-single-stream-separate-attribs"));
	addChild(new TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream(
		m_context, m_api, "multiple-streams-one-buffer-per-stream"));
	addChild(new TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream(
		m_context, m_api, "multiple-streams-multiple-buffers-per-stream"));
}